

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorTiled.cpp
# Opt level: O3

void __thiscall
Rml::DecoratorTiled::Tile::GenerateGeometry
          (Tile *this,Mesh *mesh,ComputedValues *computed,Vector2f surface_origin,
          Vector2f surface_dimensions,Vector2f tile_dimensions)

{
  Vector2f VVar1;
  Type TVar2;
  Colourb CVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  bool bVar8;
  bool bVar9;
  long lVar10;
  float *pfVar11;
  Vector2f *pVVar12;
  Vector2f *pVVar13;
  Vector2f *pVVar14;
  float fVar15;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  float fVar17;
  undefined8 in_XMM1_Qb;
  undefined1 auVar16 [16];
  float fVar18;
  float fVar19;
  undefined4 in_XMM2_Dc;
  undefined4 in_XMM2_Dd;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  Vector2f tile_position;
  Vector2f local_98;
  Mesh *local_90;
  Vector2f local_88;
  Vector2f VStack_80;
  undefined8 local_78;
  Vector2f local_70;
  float local_68;
  float local_58;
  float fStack_54;
  undefined4 uStack_50;
  float fStack_4c;
  undefined1 local_48 [16];
  Vector2f local_38;
  
  fVar18 = tile_dimensions.x;
  fVar19 = tile_dimensions.y;
  auVar16._8_8_ = in_XMM1_Qb;
  auVar16._0_8_ = surface_dimensions;
  local_70 = surface_dimensions;
  fVar15 = surface_dimensions.x;
  if (fVar15 <= 0.0) {
    return;
  }
  fVar17 = surface_dimensions.y;
  if (fVar17 <= 0.0) {
    return;
  }
  if (this->tile_data_calculated != true) {
    return;
  }
  CVar3 = (computed->rare).image_color;
  fVar20 = (float)((uint)CVar3 >> 0x18) * (computed->inherited).opacity;
  fVar21 = fVar20 / 255.0;
  VVar1 = (this->tile_data).texcoords[0];
  fVar24 = VVar1.x;
  fVar25 = VVar1.y;
  VVar1 = (this->tile_data).texcoords[1];
  fVar22 = VVar1.x - fVar24;
  fVar23 = VVar1.y - fVar25;
  lVar10 = (ulong)this->orientation * 0x10;
  local_88.x = (float)*(undefined8 *)(oriented_texcoords + lVar10) * fVar22 + fVar24;
  local_88.y = (float)((ulong)*(undefined8 *)(oriented_texcoords + lVar10) >> 0x20) * fVar23 +
               fVar25;
  VStack_80.x = (float)*(undefined8 *)(oriented_texcoords + lVar10 + 8) * fVar22 + fVar24;
  VStack_80.y = (float)((ulong)*(undefined8 *)(oriented_texcoords + lVar10 + 8) >> 0x20) * fVar23 +
                fVar25;
  local_98.x = 0.0;
  local_98.y = 0.0;
  fVar24 = 1.0;
  fVar25 = 1.0;
  switch(this->fit_mode) {
  case FILL:
    local_98 = surface_dimensions;
    break;
  case CONTAIN:
    auVar7._8_4_ = in_XMM2_Dc;
    auVar7._0_8_ = tile_dimensions;
    auVar7._12_4_ = in_XMM2_Dd;
    auVar16 = divps(auVar16,auVar7);
    fVar15 = auVar16._4_4_;
    if (auVar16._0_4_ <= auVar16._4_4_) {
      fVar15 = auVar16._0_4_;
    }
    goto LAB_00210549;
  case COVER:
    auVar6._8_4_ = in_XMM2_Dc;
    auVar6._0_8_ = tile_dimensions;
    auVar6._12_4_ = in_XMM2_Dd;
    auVar16 = divps(auVar16,auVar6);
    fVar15 = auVar16._4_4_;
    if (auVar16._4_4_ <= auVar16._0_4_) {
      fVar15 = auVar16._0_4_;
    }
LAB_00210549:
    local_98.y = fVar15 * fVar19;
    local_98.x = fVar15 * fVar18;
LAB_00210553:
    local_58 = 1.0;
    fStack_54 = 1.0;
    fVar17 = 0.0;
    goto LAB_0021055a;
  case SCALE_DOWN:
    auVar5._8_4_ = in_XMM2_Dc;
    auVar5._0_8_ = tile_dimensions;
    auVar5._12_4_ = in_XMM2_Dd;
    auVar16 = divps(auVar16,auVar5);
    fVar15 = auVar16._4_4_;
    if (auVar16._0_4_ <= auVar16._4_4_) {
      fVar15 = auVar16._0_4_;
    }
    if (fVar15 < 1.0) {
      fVar18 = fVar18 * fVar15;
      fVar19 = fVar19 * fVar15;
    }
  case SCALE_NONE:
    local_98.y = fVar19;
    local_98.x = fVar18;
    goto LAB_00210553;
  case REPEAT:
    auVar4._8_4_ = in_XMM2_Dc;
    auVar4._0_8_ = tile_dimensions;
    auVar4._12_4_ = in_XMM2_Dd;
    auVar16 = divps(auVar16,auVar4);
    fVar24 = auVar16._0_4_;
    fVar25 = auVar16._4_4_;
    local_98 = surface_dimensions;
    break;
  case REPEAT_X:
    local_98.y = fVar19;
    local_98.x = fVar15;
    local_58 = fVar15 / fVar18;
    fStack_54 = 1.0;
    fVar17 = 0.0;
    goto LAB_0021055a;
  case REPEAT_Y:
    local_98.y = fVar17;
    local_98.x = fVar18;
    fStack_54 = fVar17 / fVar19;
    local_58 = 1.0;
LAB_0021055a:
    local_48._8_4_ = in_XMM0_Dc;
    local_48._0_8_ = surface_origin;
    local_48._12_4_ = in_XMM0_Dd;
    local_78 = 0;
    lVar10 = 0;
    pfVar11 = (float *)&local_78;
    pVVar12 = &local_98;
    pVVar13 = &local_70;
    bVar8 = true;
    do {
      bVar9 = bVar8;
      TVar2 = this->align[lVar10].type;
      if (TVar2 == Percentage) {
        fVar15 = (pVVar13->x - pVVar12->x) * this->align[lVar10].value * 0.01;
LAB_002105c0:
        *pfVar11 = fVar15;
      }
      else if (TVar2 == Length) {
        fVar15 = this->align[lVar10].value;
        goto LAB_002105c0;
      }
      lVar10 = 1;
      pfVar11 = (float *)((long)&local_78 + 4);
      pVVar12 = (Vector2f *)&local_98.y;
      pVVar13 = (Vector2f *)&local_70.y;
      bVar8 = false;
    } while (bVar9);
    uStack_50 = 0;
    local_90 = mesh;
    fStack_4c = fVar17;
    local_68 = Math::Round((float)local_78);
    fVar15 = Math::Round(local_78._4_4_);
    local_78 = CONCAT44(fVar15,local_68);
    lVar10 = 0;
    pVVar12 = &local_98;
    pVVar13 = &local_88;
    pVVar14 = &local_70;
    pfVar11 = (float *)&local_78;
    bVar8 = true;
    do {
      bVar9 = bVar8;
      fVar15 = *pfVar11;
      fVar18 = 0.0;
      if (0.0 <= -fVar15) {
        fVar18 = -fVar15;
      }
      fVar19 = pVVar12->x;
      fVar24 = (fVar15 + fVar19) - pVVar14->x;
      fVar17 = 0.0;
      if (0.0 <= fVar24) {
        fVar17 = fVar24;
      }
      if ((0.0 < fVar18) || (0.0 < fVar17)) {
        fVar24 = (&VStack_80.x)[lVar10];
        fVar25 = fVar24 - pVVar13->x;
        pVVar13->x = (fVar18 / fVar19) * fVar25 + pVVar13->x;
        (&VStack_80.x)[lVar10] = fVar24 - (fVar17 / fVar19) * fVar25;
        pVVar12->x = fVar19 - (fVar18 + fVar17);
        *pfVar11 = fVar15 + fVar18;
      }
      lVar10 = 1;
      pVVar12 = (Vector2f *)&local_98.y;
      mesh = local_90;
      pVVar13 = (Vector2f *)&local_88.y;
      pVVar14 = (Vector2f *)&local_70.y;
      pfVar11 = (float *)((long)&local_78 + 4);
      fVar15 = (float)local_48._0_4_;
      fVar18 = (float)local_48._4_4_;
      fVar24 = local_58;
      fVar25 = fStack_54;
      bVar8 = false;
    } while (bVar9);
    goto LAB_002106ef;
  }
  local_78 = 0;
  fVar15 = surface_origin.x;
  fVar18 = surface_origin.y;
LAB_002106ef:
  local_88.y = fVar25 * local_88.y;
  local_88.x = fVar24 * local_88.x;
  VStack_80.y = fVar25 * VStack_80.y;
  VStack_80.x = fVar24 * VStack_80.x;
  local_38.x = (float)local_78 + fVar15;
  local_38.y = (float)((ulong)local_78 >> 0x20) + fVar18;
  Math::SnapToPixelGrid(&local_38,&local_98);
  MeshUtilities::GenerateQuad
            (mesh,local_38,local_98,
             (ColourbPremultiplied)
             ((int)((float)((uint)CVar3 & 0xff) * fVar21) & 0xffU |
             ((int)((float)((uint)CVar3 >> 8 & 0xff) * fVar21) & 0xffU) << 8 |
             ((int)((float)((uint)CVar3 >> 0x10 & 0xff) * fVar21) & 0xffU) << 0x10 |
             (int)fVar20 << 0x18),local_88,VStack_80);
  return;
}

Assistant:

void DecoratorTiled::Tile::GenerateGeometry(Mesh& mesh, const ComputedValues& computed, const Vector2f surface_origin,
	const Vector2f surface_dimensions, const Vector2f tile_dimensions) const
{
	if (surface_dimensions.x <= 0 || surface_dimensions.y <= 0)
		return;

	const ColourbPremultiplied quad_colour = computed.image_color().ToPremultiplied(computed.opacity());

	if (!tile_data_calculated)
		return;

	// Generate the oriented texture coordinates for the tiles.
	Vector2f scaled_texcoords[2];
	for (int i = 0; i < 2; i++)
	{
		scaled_texcoords[i] = tile_data.texcoords[0] + oriented_texcoords[orientation][i] * (tile_data.texcoords[1] - tile_data.texcoords[0]);
	}

	Vector2f final_tile_dimensions;
	bool offset_and_clip_tile = false;
	Vector2f repeat_factor = Vector2f(1);

	switch (fit_mode)
	{
	case FILL:
	{
		final_tile_dimensions = surface_dimensions;
	}
	break;
	case CONTAIN:
	{
		Vector2f scale_factor = surface_dimensions / tile_dimensions;
		float min_factor = std::min(scale_factor.x, scale_factor.y);
		final_tile_dimensions = tile_dimensions * min_factor;

		offset_and_clip_tile = true;
	}
	break;
	case COVER:
	{
		Vector2f scale_factor = surface_dimensions / tile_dimensions;
		float max_factor = std::max(scale_factor.x, scale_factor.y);
		final_tile_dimensions = tile_dimensions * max_factor;

		offset_and_clip_tile = true;
	}
	break;
	case SCALE_NONE:
	{
		final_tile_dimensions = tile_dimensions;

		offset_and_clip_tile = true;
	}
	break;
	case SCALE_DOWN:
	{
		Vector2f scale_factor = surface_dimensions / tile_dimensions;
		float min_factor = std::min(scale_factor.x, scale_factor.y);
		if (min_factor < 1.0f)
			final_tile_dimensions = tile_dimensions * min_factor;
		else
			final_tile_dimensions = tile_dimensions;

		offset_and_clip_tile = true;
	}
	break;
	case REPEAT:
		final_tile_dimensions = surface_dimensions;
		repeat_factor = surface_dimensions / tile_dimensions;
		break;
	case REPEAT_X:
		final_tile_dimensions = Vector2f(surface_dimensions.x, tile_dimensions.y);
		repeat_factor.x = surface_dimensions.x / tile_dimensions.x;
		offset_and_clip_tile = true;
		break;
	case REPEAT_Y:
		final_tile_dimensions = Vector2f(tile_dimensions.x, surface_dimensions.y);
		repeat_factor.y = surface_dimensions.y / tile_dimensions.y;
		offset_and_clip_tile = true;
		break;
	}

	Vector2f tile_offset(0, 0);

	if (offset_and_clip_tile)
	{
		// Offset tile along each dimension.
		for (int i = 0; i < 2; i++)
		{
			switch (align[i].type)
			{
			case Style::LengthPercentage::Length: tile_offset[i] = align[i].value; break;
			case Style::LengthPercentage::Percentage:
				tile_offset[i] = (surface_dimensions[i] - final_tile_dimensions[i]) * align[i].value * 0.01f;
				break;
			}
		}
		tile_offset = tile_offset.Round();

		// Clip tile. See if our tile extends outside the boundary at either side, along each dimension.
		for (int i = 0; i < 2; i++)
		{
			// Left/right acts as top/bottom during the second iteration.
			float overshoot_left = std::max(-tile_offset[i], 0.0f);
			float overshoot_right = std::max(tile_offset[i] + final_tile_dimensions[i] - surface_dimensions[i], 0.0f);

			if (overshoot_left > 0.f || overshoot_right > 0.f)
			{
				float& left = scaled_texcoords[0][i];
				float& right = scaled_texcoords[1][i];
				float width = right - left;

				left += overshoot_left / final_tile_dimensions[i] * width;
				right -= overshoot_right / final_tile_dimensions[i] * width;

				final_tile_dimensions[i] -= overshoot_left + overshoot_right;
				tile_offset[i] += overshoot_left;
			}
		}
	}

	scaled_texcoords[0] *= repeat_factor;
	scaled_texcoords[1] *= repeat_factor;

	// Generate the vertices for the tiled surface.
	Vector2f tile_position = (surface_origin + tile_offset);
	Math::SnapToPixelGrid(tile_position, final_tile_dimensions);

	MeshUtilities::GenerateQuad(mesh, tile_position, final_tile_dimensions, quad_colour, scaled_texcoords[0], scaled_texcoords[1]);
}